

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# box_renderer.cpp
# Opt level: O2

void __thiscall
duckdb::BoxRenderer::RenderRowCount
          (BoxRenderer *this,string *row_count_str,string *shown_str,string *column_count_str,
          vector<unsigned_long,_true> *boundaries,bool has_hidden_rows,bool has_hidden_columns,
          idx_t total_length,idx_t row_count,idx_t column_count,idx_t minimum_row_length,
          BaseResultRenderer *ss)

{
  BoxRenderer *pBVar1;
  string *psVar2;
  byte bVar3;
  const_reference pvVar4;
  char cVar5;
  size_type sVar6;
  ulong uVar7;
  long lVar8;
  undefined7 in_register_00000089;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unaff_R14;
  undefined7 uVar9;
  idx_t k;
  value_type vVar10;
  bool bVar11;
  allocator local_83;
  byte local_82;
  char local_81;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  BoxRenderer *local_60;
  undefined4 local_58;
  uint local_54;
  string *local_50;
  string *local_48;
  string *local_40;
  long local_38;
  
  sVar6 = row_count_str->_M_string_length;
  local_60 = this;
  if ((int)CONCAT71(in_register_00000089,has_hidden_rows) == 0) {
LAB_0031eb8d:
    local_58 = 0;
  }
  else {
    local_58 = (undefined4)CONCAT71((int7)((ulong)row_count_str >> 8),1);
    if (shown_str->_M_string_length + sVar6 + 5 <= total_length) {
      ::std::operator+(&local_80," ",shown_str);
      ::std::__cxx11::string::append((string *)row_count_str);
      ::std::__cxx11::string::~string((string *)&local_80);
      local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
      local_80._M_string_length = 0;
      local_80.field_2._M_local_buf[0] = '\0';
      unaff_R14 = &local_80;
      ::std::__cxx11::string::operator=((string *)shown_str,(string *)unaff_R14);
      ::std::__cxx11::string::~string((string *)unaff_R14);
      sVar6 = row_count_str->_M_string_length;
      minimum_row_length = sVar6 + 4;
      goto LAB_0031eb8d;
    }
  }
  if (total_length < sVar6 + column_count_str->_M_string_length + 6) {
    uVar7 = 0;
  }
  else {
    uVar9 = (undefined7)((ulong)unaff_R14 >> 8);
    uVar7 = CONCAT71(uVar9,1);
    if (!has_hidden_columns || row_count == 0) {
      uVar7 = CONCAT71(uVar9,1 < column_count && 9 < row_count);
    }
  }
  cVar5 = row_count - 10 < 0xfffffffffffffff7 && minimum_row_length <= total_length;
  bVar3 = cVar5 | (byte)uVar7;
  local_50 = row_count_str;
  local_48 = shown_str;
  if (row_count != 0) {
    local_38 = (ulong)bVar3 * 0x20;
    local_82 = bVar3;
    local_81 = cVar5;
    ::std::__cxx11::string::string
              ((string *)&local_80,(&(local_60->config).LDCORNER)[(ulong)bVar3 * 4],&local_83);
    local_54 = (uint)uVar7;
    local_40 = column_count_str;
    (*ss->_vptr_BaseResultRenderer[2])(ss,&local_80);
    ::std::__cxx11::string::~string((string *)&local_80);
    uVar7 = 0;
    for (vVar10 = 0; total_length - 2 != vVar10; vVar10 = vVar10 + 1) {
      if ((uVar7 + 1 <
           (ulong)((long)(boundaries->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)(boundaries->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_start >> 3)) &&
         (pvVar4 = vector<unsigned_long,_true>::get<true>(boundaries,uVar7), vVar10 == *pvVar4)) {
        ::std::__cxx11::string::string((string *)&local_80,(local_60->config).DMIDDLE,&local_83);
        (*ss->_vptr_BaseResultRenderer[2])(ss,&local_80);
        ::std::__cxx11::string::~string((string *)&local_80);
        uVar7 = uVar7 + 1;
      }
      else {
        ::std::__cxx11::string::string((string *)&local_80,(local_60->config).HORIZONTAL,&local_83);
        (*ss->_vptr_BaseResultRenderer[2])(ss,&local_80);
        ::std::__cxx11::string::~string((string *)&local_80);
      }
    }
    ::std::__cxx11::string::string
              ((string *)&local_80,*(char **)((long)&(local_60->config).RDCORNER + local_38),
               &local_83);
    (*ss->_vptr_BaseResultRenderer[2])(ss,&local_80);
    column_count_str = local_40;
    uVar7 = (ulong)local_54;
    ::std::__cxx11::string::~string((string *)&local_80);
    BaseResultRenderer::operator<<(ss,'\n');
    cVar5 = local_81;
    bVar3 = local_82;
  }
  pBVar1 = local_60;
  if (bVar3 == 0) {
    return;
  }
  if ((char)uVar7 == '\0') {
    if (cVar5 == '\0') goto LAB_0031ef76;
    RenderValue(local_60,ss,local_50,total_length - 4,FOOTER,MIDDLE);
    ::std::__cxx11::string::string((string *)&local_80,(pBVar1->config).VERTICAL,&local_83);
    (*ss->_vptr_BaseResultRenderer[2])(ss,&local_80);
    ::std::__cxx11::string::~string((string *)&local_80);
    BaseResultRenderer::operator<<(ss,'\n');
    pBVar1 = local_60;
    if ((char)local_58 == '\0') goto LAB_0031ef76;
    RenderValue(local_60,ss,local_48,total_length - 4,FOOTER,MIDDLE);
    ::std::__cxx11::string::string((string *)&local_80,(pBVar1->config).VERTICAL,&local_83);
    (*ss->_vptr_BaseResultRenderer[2])(ss,&local_80);
    ::std::__cxx11::string::~string((string *)&local_80);
  }
  else {
    ::std::__cxx11::string::string((string *)&local_80,(local_60->config).VERTICAL,&local_83);
    (*ss->_vptr_BaseResultRenderer[2])(ss,&local_80);
    ::std::__cxx11::string::~string((string *)&local_80);
    ::std::__cxx11::string::string((string *)&local_80," ",&local_83);
    (*ss->_vptr_BaseResultRenderer[2])(ss,&local_80);
    ::std::__cxx11::string::~string((string *)&local_80);
    psVar2 = local_50;
    (*ss->_vptr_BaseResultRenderer[7])(ss,local_50);
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    ::std::__cxx11::string::_M_construct
              ((ulong)&local_80,
               ((char)total_length -
               ((char)psVar2->_M_string_length + (char)column_count_str->_M_string_length)) + -4);
    (*ss->_vptr_BaseResultRenderer[2])(ss,&local_80);
    ::std::__cxx11::string::~string((string *)&local_80);
    (*ss->_vptr_BaseResultRenderer[7])(ss,column_count_str);
    ::std::__cxx11::string::string((string *)&local_80," ",&local_83);
    (*ss->_vptr_BaseResultRenderer[2])(ss,&local_80);
    ::std::__cxx11::string::~string((string *)&local_80);
    ::std::__cxx11::string::string((string *)&local_80,(local_60->config).VERTICAL,&local_83);
    (*ss->_vptr_BaseResultRenderer[2])(ss,&local_80);
    ::std::__cxx11::string::~string((string *)&local_80);
  }
  BaseResultRenderer::operator<<(ss,'\n');
LAB_0031ef76:
  ::std::__cxx11::string::string((string *)&local_80,(local_60->config).LDCORNER,&local_83);
  (*ss->_vptr_BaseResultRenderer[2])(ss,&local_80);
  ::std::__cxx11::string::~string((string *)&local_80);
  lVar8 = total_length - 2;
  while (bVar11 = lVar8 != 0, lVar8 = lVar8 + -1, bVar11) {
    ::std::__cxx11::string::string((string *)&local_80,(local_60->config).HORIZONTAL,&local_83);
    (*ss->_vptr_BaseResultRenderer[2])(ss,&local_80);
    ::std::__cxx11::string::~string((string *)&local_80);
  }
  ::std::__cxx11::string::string((string *)&local_80,(local_60->config).RDCORNER,&local_83);
  (*ss->_vptr_BaseResultRenderer[2])(ss,&local_80);
  ::std::__cxx11::string::~string((string *)&local_80);
  BaseResultRenderer::operator<<(ss,'\n');
  return;
}

Assistant:

void BoxRenderer::RenderRowCount(string row_count_str, string shown_str, const string &column_count_str,
                                 const vector<idx_t> &boundaries, bool has_hidden_rows, bool has_hidden_columns,
                                 idx_t total_length, idx_t row_count, idx_t column_count, idx_t minimum_row_length,
                                 BaseResultRenderer &ss) {
	// check if we can merge the row_count_str and the shown_str
	bool display_shown_separately = has_hidden_rows;
	if (has_hidden_rows && total_length >= row_count_str.size() + shown_str.size() + 5) {
		// we can!
		row_count_str += " " + shown_str;
		shown_str = string();
		display_shown_separately = false;
		minimum_row_length = row_count_str.size() + 4;
	}
	auto minimum_length = row_count_str.size() + column_count_str.size() + 6;
	bool render_rows_and_columns = total_length >= minimum_length &&
	                               ((has_hidden_columns && row_count > 0) || (row_count >= 10 && column_count > 1));
	bool render_rows = total_length >= minimum_row_length && (row_count == 0 || row_count >= 10);
	bool render_anything = true;
	if (!render_rows && !render_rows_and_columns) {
		render_anything = false;
	}
	// render the bottom of the result values, if there are any
	if (row_count > 0) {
		ss << (render_anything ? config.LMIDDLE : config.LDCORNER);
		idx_t column_index = 0;
		for (idx_t k = 0; k < total_length - 2; k++) {
			if (column_index + 1 < boundaries.size() && k == boundaries[column_index]) {
				ss << config.DMIDDLE;
				column_index++;
			} else {
				ss << config.HORIZONTAL;
			}
		}
		ss << (render_anything ? config.RMIDDLE : config.RDCORNER);
		ss << '\n';
	}
	if (!render_anything) {
		return;
	}

	if (render_rows_and_columns) {
		ss << config.VERTICAL;
		ss << " ";
		ss.Render(ResultRenderType::FOOTER, row_count_str);
		ss << string(total_length - row_count_str.size() - column_count_str.size() - 4, ' ');
		ss.Render(ResultRenderType::FOOTER, column_count_str);
		ss << " ";
		ss << config.VERTICAL;
		ss << '\n';
	} else if (render_rows) {
		RenderValue(ss, row_count_str, total_length - 4, ResultRenderType::FOOTER);
		ss << config.VERTICAL;
		ss << '\n';

		if (display_shown_separately) {
			RenderValue(ss, shown_str, total_length - 4, ResultRenderType::FOOTER);
			ss << config.VERTICAL;
			ss << '\n';
		}
	}
	// render the bottom line
	ss << config.LDCORNER;
	for (idx_t k = 0; k < total_length - 2; k++) {
		ss << config.HORIZONTAL;
	}
	ss << config.RDCORNER;
	ss << '\n';
}